

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

string * __thiscall OutputRedirect::restore_and_read_abi_cxx11_(OutputRedirect *this)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  long in_RSI;
  undefined1 *puVar3;
  string *in_RDI;
  streamsize count;
  char buffer [4096];
  string *content;
  OutputRedirect *in_stack_ffffffffffffefb0;
  undefined1 local_1018 [4103];
  undefined1 local_11;
  
  restore(in_stack_ffffffffffffefb0);
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  iVar1 = fmt::File::descriptor((File *)(in_RSI + 0xc));
  if (iVar1 != -1) {
    do {
      sVar2 = fmt::File::read((File *)(in_RSI + 0xc),(int)local_1018,(void *)0x1000,in_RCX);
      puVar3 = local_1018;
      std::__cxx11::string::append((char *)in_RDI,(ulong)puVar3);
    } while (sVar2 != 0);
    fmt::File::close((File *)(in_RSI + 0xc),(int)puVar3);
  }
  return in_RDI;
}

Assistant:

std::string OutputRedirect::restore_and_read() {
  // Restore output.
  restore();

  // Read everything from the pipe.
  std::string content;
  if (read_end_.descriptor() == -1)
    return content;  // Already read.
  enum { BUFFER_SIZE = 4096 };
  char buffer[BUFFER_SIZE];
  std::streamsize count = 0;
  do {
    count = read_end_.read(buffer, BUFFER_SIZE);
    content.append(buffer, static_cast<std::size_t>(count));
  } while (count != 0);
  read_end_.close();
  return content;
}